

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_print.c
# Opt level: O0

rfc5444_result rfc5444_print_direct(autobuf *out,void *buffer,size_t length)

{
  rfc5444_result result_00;
  char *pcVar1;
  undefined1 auStack_218 [4];
  rfc5444_result result;
  rfc5444_print_session session;
  rfc5444_reader reader;
  size_t length_local;
  void *buffer_local;
  autobuf *out_local;
  
  memset(&session._reader,0,0x78);
  memset(auStack_218,0,0x180);
  _auStack_218 = out;
  rfc5444_reader_init((rfc5444_reader *)&session._reader);
  rfc5444_print_add((rfc5444_print_session *)auStack_218,(rfc5444_reader *)&session._reader);
  result_00 = rfc5444_reader_handle_packet
                        ((rfc5444_reader *)&session._reader,(uint8_t *)buffer,length);
  if (result_00 != RFC5444_OKAY) {
    pcVar1 = rfc5444_strerror(result_00);
    abuf_appendf(out,"Error while parsing rfc5444: %s\n",pcVar1);
  }
  rfc5444_print_remove((rfc5444_print_session *)auStack_218);
  rfc5444_reader_cleanup((rfc5444_reader *)&session._reader);
  return result_00;
}

Assistant:

enum rfc5444_result
rfc5444_print_direct(struct autobuf *out, void *buffer, size_t length)
{
  struct rfc5444_reader reader;
  struct rfc5444_print_session session;
  enum rfc5444_result result;

  memset(&reader, 0, sizeof(reader));
  memset(&session, 0, sizeof(session));

  session.output = out;

  rfc5444_reader_init(&reader);
  rfc5444_print_add(&session, &reader);

  result = rfc5444_reader_handle_packet(&reader, buffer, length);
  if (result) {
    abuf_appendf(out, "Error while parsing rfc5444: %s\n", rfc5444_strerror(result));
  }
  rfc5444_print_remove(&session);
  rfc5444_reader_cleanup(&reader);

  return result;
}